

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qemulationpaintengine.cpp
# Opt level: O0

void combineXForm(QBrush *brush,QRectF *r)

{
  CoordinateMode CVar1;
  QGradient *pQVar2;
  QRectF *in_RSI;
  QTransform *in_RDI;
  long in_FS_OFFSET;
  qreal h11;
  QBrush *this;
  qreal dx;
  qreal dy;
  QTransform t;
  QBrush *in_stack_fffffffffffffe28;
  QBrush *in_stack_fffffffffffffe30;
  QTransform *in_stack_fffffffffffffe38;
  QTransform *in_stack_fffffffffffffee8;
  QTransform *in_stack_fffffffffffffef0;
  QTransform local_58;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&local_58,&DAT_00baf118,0x50);
  h11 = QRectF::width(in_RSI);
  this = (QBrush *)QRectF::height(in_RSI);
  dx = QRectF::x(in_RSI);
  dy = QRectF::y(in_RSI);
  QTransform::QTransform(&local_58,h11,0.0,0.0,(qreal)this,dx,dy);
  pQVar2 = QBrush::gradient(in_stack_fffffffffffffe28);
  if (pQVar2 != (QGradient *)0x0) {
    pQVar2 = QBrush::gradient(in_stack_fffffffffffffe28);
    CVar1 = QGradient::coordinateMode(pQVar2);
    if (CVar1 != ObjectMode) {
      QBrush::transform(in_stack_fffffffffffffe30);
      QTransform::operator*(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      QBrush::setTransform(this,in_RDI);
      goto LAB_0050f3a6;
    }
  }
  QBrush::transform((QBrush *)in_RDI);
  QTransform::operator*(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  QBrush::setTransform(this,in_stack_fffffffffffffe38);
LAB_0050f3a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void combineXForm(QBrush *brush, const QRectF &r)
{
    QTransform t(r.width(), 0, 0, r.height(), r.x(), r.y());
    if (brush->gradient() && brush->gradient()->coordinateMode() != QGradient::ObjectMode)
        brush->setTransform(t * brush->transform()); // compat mode
    else
        brush->setTransform(brush->transform() * t);
}